

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_50a29::AndExpr::parse_non_term(AndExpr *this,Context *con)

{
  int iVar1;
  element_type *peVar2;
  undefined1 local_38 [7];
  bool ok;
  ParsingState st;
  Context *con_local;
  AndExpr *this_local;
  
  st.matches = (size_t)con;
  ParsingState::ParsingState((ParsingState *)local_38,con);
  peVar2 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_UnaryExpr).expr);
  iVar1 = (*peVar2->_vptr_Expr[2])(peVar2,st.matches);
  pegmatite::Context::restore((Context *)st.matches,(ParsingState *)local_38);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

virtual bool parse_non_term(Context &con) const
	{
		ParsingState st(con);
		bool ok = expr->parse_non_term(con);
		con.restore(st);
		return ok;
	}